

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

void SubtractRegion(QRegionPrivate *regM,QRegionPrivate *regS,QRegionPrivate *dest)

{
  miRegionOp(dest,regM,regS,miSubtractO,miSubtractNonO1,(NonOverlapFunc)0x0);
  miSetExtents(dest);
  return;
}

Assistant:

static void SubtractRegion(QRegionPrivate *regM, QRegionPrivate *regS,
                           QRegionPrivate &dest)
{
    Q_ASSERT(!isEmptyHelper(regM));
    Q_ASSERT(!isEmptyHelper(regS));
    Q_ASSERT(EXTENTCHECK(&regM->extents, &regS->extents));
    Q_ASSERT(!regS->contains(*regM));
    Q_ASSERT(!EqualRegion(regM, regS));

    miRegionOp(dest, regM, regS, miSubtractO, miSubtractNonO1, nullptr);

    /*
     * Can't alter dest's extents before we call miRegionOp because
     * it might be one of the source regions and miRegionOp depends
     * on the extents of those regions being the unaltered. Besides, this
     * way there's no checking against rectangles that will be nuked
     * due to coalescing, so we have to examine fewer rectangles.
     */
    miSetExtents(dest);
}